

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmodule.cpp
# Opt level: O1

Ref __thiscall trun::TestModule::ExecuteExit(TestModule *this,Ref *dynlib)

{
  element_type *dynlib_00;
  Config *pCVar1;
  ResultSummary *this_00;
  CBPrePostHook *in_RDX;
  CBPrePostHook *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  Ref RVar3;
  Ref local_48;
  CBPrePostHook local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  CBPrePostHook local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  if (dynlib[9].super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pCVar1 = Config::Instance();
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    if (pCVar1->testModuleGlobals != false) {
      dynlib_00 = dynlib[9].super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_38 = *in_RDX;
      local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1].cbHookV1;
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_30->_M_use_count = local_30->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_30->_M_use_count = local_30->_M_use_count + 1;
        }
      }
      local_20.cbHookV1 = (TRUN_PRE_POST_HOOK_DELEGATE_V1 *)0x0;
      local_28 = 0;
      RVar3 = TestFunc::Execute((TestFunc *)this,(Ref *)dynlib_00,&local_38,&local_20);
      _Var2 = RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
        _Var2._M_pi = extraout_RDX_00;
      }
      if (this->_vptr_TestModule != (_func_int **)0x0) {
        this_00 = ResultSummary::Instance();
        local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             dynlib[9].super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             dynlib[9].super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ResultSummary::AddResult(this_00,&local_48);
        _Var2._M_pi = extraout_RDX_01;
        if (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var2._M_pi = extraout_RDX_02;
        }
      }
      goto LAB_001624d4;
    }
  }
  this->_vptr_TestModule = (_func_int **)0x0;
  *(undefined8 *)&this->state = 0;
LAB_001624d4:
  RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref)RVar3.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestResult::Ref TestModule::ExecuteExit(const IDynLibrary::Ref &dynlib) {
    if (exitFunc == nullptr) return nullptr;
    if (!Config::Instance().testModuleGlobals) return nullptr;

    auto testResult = exitFunc->Execute(dynlib, {}, {});

    if (testResult != nullptr) {
        ResultSummary::Instance().AddResult(exitFunc);
    }
    return testResult;
}